

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Reg4(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  RegSlot R3_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x7);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x204,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cad26;
    *puVar3 = 0;
  }
  R0_00 = ConsumeReg(this,R0);
  R1_00 = ConsumeReg(this,R1);
  R2_00 = ConsumeReg(this,R2);
  R3_00 = ConsumeReg(this,R3);
  bVar2 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,R1_00,R2_00,R3_00);
  if (!bVar2) {
    bVar2 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,R1_00,R2_00,R3_00);
    if (!bVar2) {
      bVar2 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,R0_00,R1_00,R2_00,R3_00)
      ;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x20b,"(success)","success");
        if (!bVar2) {
LAB_007cad26:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg4(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg4);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);

        MULTISIZE_LAYOUT_WRITE(Reg4, op, R0, R1, R2, R3);
    }